

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O1

QRect __thiscall
QFusionStyle::subControlRect
          (QFusionStyle *this,ComplexControl control,QStyleOptionComplex *option,
          SubControl subControl,QWidget *widget)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  undefined4 uVar4;
  undefined1 auVar5 [12];
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  QStyle *pQVar11;
  QStyle *pQVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  Representation RVar16;
  ulong extraout_RDX;
  QStyleOptionComplex *pQVar17;
  uint uVar18;
  QRect *pQVar19;
  int iVar20;
  int iVar21;
  Representation RVar22;
  uint uVar23;
  Representation RVar24;
  int iVar25;
  int iVar26;
  LayoutDirection LVar27;
  long in_FS_OFFSET;
  qreal qVar28;
  qreal qVar29;
  QRect QVar30;
  undefined1 auVar31 [16];
  QRect QVar32;
  QRect QVar33;
  int local_78;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  _local_48 = QCommonStyle::subControlRect
                        (&this->super_QCommonStyle,control,option,subControl,widget);
  uVar15 = local_48._8_8_;
  if (CC_GroupBox < control) goto switchD_003c15b4_caseD_2;
  switch(control) {
  case CC_SpinBox:
    if (((option == (QStyleOptionComplex *)0x0) || ((option->super_QStyleOption).version < 1)) ||
       (pQVar17 = option, (option->super_QStyleOption).type != 0xf0002)) {
      pQVar17 = (QStyleOptionComplex *)0x0;
    }
    if (pQVar17 == (QStyleOptionComplex *)0x0) break;
    pQVar19 = &(pQVar17->super_QStyleOption).rect;
    iVar8 = (pQVar17->super_QStyleOption).rect.y2.m_i - (pQVar17->super_QStyleOption).rect.y1.m_i;
    bVar3 = (byte)pQVar17[1].super_QStyleOption.state.
                  super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                  super_QFlagsStorage<QStyle::StateFlag>.i;
    uVar18 = 0xfffffffa;
    if (bVar3 == 0) {
      uVar18 = (uint)bVar3;
    }
    qVar29 = QStyleHelper::dpiScaled(14.0,&option->super_QStyleOption);
    if (subControl - SC_ComboBoxFrame < 8) {
      RVar16.m_i = (iVar8 - (iVar8 + 1 >> 0x1f)) + 1 >> 1;
      iVar20 = (int)qVar29;
      iVar8 = (uint)(bVar3 ^ 1) + (uint)(bVar3 ^ 1) * 2 + -3;
      iVar21 = (pQVar17->super_QStyleOption).rect.x2.m_i - (pQVar17->super_QStyleOption).rect.x1.m_i
      ;
      RVar22.m_i = (uint)bVar3 + (uint)bVar3 * 2;
      iVar25 = (iVar8 - iVar20) + iVar21 + 1;
      RVar24.m_i = (iVar8 - iVar20) + iVar21 + 3;
      switch(subControl) {
      case SC_ComboBoxFrame:
        if (pQVar17[1].super_QStyleOption.version == 2) {
LAB_003c1d02:
          QVar30 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
          uVar15 = 0;
          goto LAB_003c1fbd;
        }
        uStack_40._4_4_ = RVar16.m_i + -1;
        local_48._4_4_ = RVar22.m_i;
        local_48._0_4_ = RVar24.m_i;
        uStack_40._0_4_ = iVar20 + iVar25 + 1;
LAB_003c1d47:
        break;
      case SC_ComboBoxEditField:
        if (pQVar17[1].super_QStyleOption.version == 2) goto LAB_003c1d02;
        local_48._4_4_ = RVar16.m_i;
        local_48._0_4_ = RVar24.m_i;
        uStack_40._0_4_ = iVar20 + iVar25 + 1;
        uStack_40._4_4_ = iVar8 + (pQVar17->super_QStyleOption).rect.y2.m_i;
        break;
      case SC_ComboBoxArrow:
        _local_48 = *pQVar19;
        break;
      case SC_ComboBoxListBoxPopup:
        if (pQVar17[1].super_QStyleOption.version == 2) {
          uStack_40._4_4_ =
               (RVar22.m_i + uVar18 + (pQVar17->super_QStyleOption).rect.y2.m_i) -
               (pQVar17->super_QStyleOption).rect.y1.m_i;
          local_48._4_4_ = RVar22.m_i;
          local_48._0_4_ = RVar22.m_i;
          uStack_40._0_4_ = RVar22.m_i + uVar18 + iVar21;
          goto LAB_003c1d47;
        }
        iVar21 = 0;
        if (0 < RVar22.m_i + -1) {
          iVar21 = RVar22.m_i + -1;
        }
        local_48._4_4_ = RVar22.m_i;
        local_48._0_4_ = RVar22.m_i;
        uStack_40._0_4_ = ((RVar22.m_i + iVar8 + -1) - iVar21) + RVar24.m_i;
        uStack_40._4_4_ =
             ((pQVar17->super_QStyleOption).rect.y2.m_i - RVar22.m_i) -
             (pQVar17->super_QStyleOption).rect.y1.m_i;
      }
    }
    LVar27 = (pQVar17->super_QStyleOption).direction;
    goto LAB_003c1f9d;
  case CC_ComboBox:
    if (subControl == SC_ComboBoxEditField) {
      pQVar19 = &(option->super_QStyleOption).rect;
      _local_48 = QStyle::visualRect((option->super_QStyleOption).direction,pQVar19,
                                     (QRect *)local_48);
      uVar1 = (option->super_QStyleOption).rect.x1;
      uVar2 = (option->super_QStyleOption).rect.y1;
      iVar8 = (option->super_QStyleOption).rect.x2.m_i;
      qVar29 = QStyleHelper::dpiScaled(19.0,&option->super_QStyleOption);
      local_48._4_4_ = uVar2 + 2;
      local_48._0_4_ = uVar1 + 2;
      iVar21 = (uVar2 + (option->super_QStyleOption).rect.y2.m_i) -
               (option->super_QStyleOption).rect.y1.m_i;
      uStack_40._0_4_ = (iVar8 - (int)qVar29) + -2;
      uStack_40._4_4_ = iVar21 + -2;
      if (((option == (QStyleOptionComplex *)0x0) || ((option->super_QStyleOption).version < 1)) ||
         (pQVar17 = option, (option->super_QStyleOption).type != 0xf0004)) {
        pQVar17 = (QStyleOptionComplex *)0x0;
      }
      if ((pQVar17 != (QStyleOptionComplex *)0x0) &&
         ((char)pQVar17[1].super_QStyleOption.version == '\0')) {
        local_48._0_4_ = uVar1 + 4;
        if (((pQVar17->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i & 0x24) != 0) {
          local_48._4_4_ = uVar2 + 3;
          local_48._0_4_ = uVar1 + 5;
          uStack_40._0_4_ = (iVar8 - (int)qVar29) + -1;
          uStack_40._4_4_ = iVar21 + -1;
        }
      }
      LVar27 = (option->super_QStyleOption).direction;
      goto LAB_003c1f9d;
    }
    if (subControl == SC_ComboBoxArrow) {
      qVar29 = QStyleHelper::dpi(&option->super_QStyleOption);
      pQVar19 = &(option->super_QStyleOption).rect;
      QVar30 = QStyle::visualRect((option->super_QStyleOption).direction,pQVar19,(QRect *)local_48);
      _local_48 = QVar30;
      qVar28 = QStyleHelper::dpiScaled(18.0,qVar29);
      RVar24.m_i = QVar30.x2.m_i.m_i - (int)qVar28;
      uVar6 = local_48._4_4_;
      RVar22.m_i = local_48._4_4_ + -2;
      qVar29 = QStyleHelper::dpiScaled(19.0,qVar29);
      iVar8 = (uVar6 + uStack_40._4_4_) - local_48._4_4_;
      local_48._4_4_ = RVar22.m_i;
      local_48._0_4_ = RVar24.m_i;
      uStack_40._0_4_ = (int)qVar29 + RVar24.m_i + -1;
      uStack_40._4_4_ = iVar8 + 2;
      _local_48 = QStyle::visualRect((option->super_QStyleOption).direction,pQVar19,
                                     (QRect *)local_48);
      uVar15 = local_48._8_8_;
    }
    break;
  case CC_Slider:
    if (((option == (QStyleOptionComplex *)0x0) || ((option->super_QStyleOption).version < 1)) ||
       (pQVar17 = option, (option->super_QStyleOption).type != 0xf0001)) {
      pQVar17 = (QStyleOptionComplex *)0x0;
    }
    if (pQVar17 != (QStyleOptionComplex *)0x0) {
      pQVar11 = QStyle::proxy((QStyle *)
                              ((long)&switchD_003c15b4::switchdataD_006def1c +
                              (long)(int)(&switchD_003c15b4::switchdataD_006def1c)[control]));
      auVar31 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0xe,option,widget);
      uVar15 = auVar31._8_8_;
      uVar18 = auVar31._0_4_;
      if (subControl == SC_ComboBoxFrame) {
        lVar14 = (long)(pQVar17->super_QStyleOption).rect.x2.m_i +
                 (long)(pQVar17->super_QStyleOption).rect.x1.m_i;
        iVar8 = (int)((ulong)(lVar14 - (lVar14 >> 0x3f)) >> 1);
        lVar14 = (long)(pQVar17->super_QStyleOption).rect.y2.m_i +
                 (long)(pQVar17->super_QStyleOption).rect.y1.m_i;
        iVar21 = (int)((ulong)(lVar14 - (lVar14 >> 0x3f)) >> 1);
        qVar29 = QStyleHelper::dpiScaled(7.0,&option->super_QStyleOption);
        LVar27 = pQVar17[1].super_QStyleOption.direction;
        if (pQVar17[1].super_QStyleOption.version == 1) {
          RVar22.m_i = (int)qVar29 + -1 + local_48._4_4_;
          uStack_40._4_4_ = RVar22.m_i;
          if (((LVar27 & (LayoutDirectionAuto|RightToLeft)) != (LayoutDirectionAuto|RightToLeft)) &&
             (iVar21 = iVar21 + (-(LVar27 & RightToLeft) & uVar18),
             (LVar27 & LayoutDirectionAuto) != LeftToRight)) {
            iVar21 = (iVar21 - uVar18) + 1;
          }
        }
        else {
          iVar20 = (int)qVar29 + -1 + local_48._0_4_;
          uStack_40._0_4_ = iVar20;
          if (((LVar27 & (LayoutDirectionAuto|RightToLeft)) != (LayoutDirectionAuto|RightToLeft)) &&
             (iVar8 = iVar8 + (-(LVar27 & RightToLeft) & uVar18),
             (LVar27 & LayoutDirectionAuto) != LeftToRight)) {
            iVar8 = (iVar8 - uVar18) + 1;
          }
        }
        iVar20 = uStack_40._0_4_ - local_48._0_4_;
        iVar25 = uStack_40._4_4_ - local_48._4_4_;
        local_48._0_4_ = iVar8 - iVar20 / 2;
        uVar18 = iVar25 / 2;
        uVar15 = (ulong)uVar18;
        local_48._4_4_ = iVar21 - uVar18;
        uStack_40._0_4_ = local_48._0_4_ + iVar20;
        uStack_40._4_4_ = local_48._4_4_ + iVar25;
      }
      else if (subControl == SC_ComboBoxEditField) {
        iVar8 = pQVar17[1].super_QStyleOption.version;
        LVar27 = pQVar17[1].super_QStyleOption.direction & (LayoutDirectionAuto|RightToLeft);
        pQVar11 = QStyle::proxy(auVar31._0_8_);
        iVar21 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0xb,option,widget);
        if (iVar8 == 1) {
          RVar22.m_i = iVar21 + -1 + local_48._4_4_;
          uStack_40._4_4_ = RVar22.m_i;
          pQVar11 = QStyle::proxy((QStyle *)(ulong)(uint)RVar22.m_i);
          iVar8 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0xd,option,widget);
          uVar6 = local_48._0_4_;
          uVar7 = local_48._4_4_;
          iVar8 = iVar8 + local_48._0_4_;
          uStack_40._0_4_ = iVar8 + -1;
          lVar14 = (long)(pQVar17->super_QStyleOption).rect.y2.m_i +
                   (long)(pQVar17->super_QStyleOption).rect.y1.m_i;
          iVar8 = uStack_40._4_4_ - uVar7;
          uVar9 = (iVar8 - (iVar8 + 1 >> 0x1f)) + 1 >> 1;
          uVar15 = (ulong)uVar9;
          RVar22.m_i = (int)((ulong)(lVar14 - (lVar14 >> 0x3f)) >> 1) - uVar9;
          if (LVar27 != (LayoutDirectionAuto|RightToLeft)) {
            LVar27 = pQVar17[1].super_QStyleOption.direction;
            uVar15 = (ulong)LVar27;
            RVar22.m_i = RVar22.m_i + (-(LVar27 & RightToLeft) & uVar18);
            if ((LVar27 & LayoutDirectionAuto) != LeftToRight) {
              RVar22.m_i = (RVar22.m_i - uVar18) + 1;
            }
          }
          uStack_40._4_4_ = iVar8 + RVar22.m_i;
          local_48._4_4_ = RVar22.m_i;
          local_48 = (undefined1  [8])CONCAT44(local_48._4_4_,uVar6);
        }
        else {
          uVar9 = iVar21 + -1 + local_48._0_4_;
          uStack_40._0_4_ = uVar9;
          pQVar11 = QStyle::proxy((QStyle *)(ulong)uVar9);
          iVar8 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0xd,option,widget);
          iVar8 = iVar8 + local_48._4_4_;
          lVar14 = (long)(pQVar17->super_QStyleOption).rect.x2.m_i +
                   (long)(pQVar17->super_QStyleOption).rect.x1.m_i;
          iVar21 = uStack_40._0_4_ - local_48._0_4_;
          uVar9 = (iVar21 - (iVar21 + 1 >> 0x1f)) + 1 >> 1;
          uVar15 = (ulong)uVar9;
          RVar22.m_i = (int)((ulong)(lVar14 - (lVar14 >> 0x3f)) >> 1) - uVar9;
          if (LVar27 != (LayoutDirectionAuto|RightToLeft)) {
            LVar27 = pQVar17[1].super_QStyleOption.direction;
            uVar15 = (ulong)LVar27;
            RVar22.m_i = RVar22.m_i + (-(LVar27 & RightToLeft) & uVar18);
            if ((LVar27 & LayoutDirectionAuto) != LeftToRight) {
              RVar22.m_i = (RVar22.m_i - uVar18) + 1;
            }
          }
          uStack_40._0_4_ = iVar21 + RVar22.m_i;
          uStack_40._4_4_ = iVar8 + -1;
          local_48._0_4_ = RVar22.m_i;
        }
      }
    }
    break;
  case CC_TitleBar:
    if (((option == (QStyleOptionComplex *)0x0) || ((option->super_QStyleOption).version < 1)) ||
       ((option->super_QStyleOption).type != 0xf0005)) {
      option = (QStyleOptionComplex *)0x0;
    }
    if (option == (QStyleOptionComplex *)0x0) break;
    pQVar19 = &(option->super_QStyleOption).rect;
    iVar21 = (option->super_QStyleOption).rect.y1.m_i;
    iVar20 = (option->super_QStyleOption).rect.y2.m_i - iVar21;
    iVar8 = iVar20 + 1;
    uVar23 = iVar20 - 3;
    uVar18 = *(uint *)&option[1].super_QStyleOption.fontMetrics;
    uVar13 = 0;
    uVar9 = 0;
    if (0x1f < (int)subControl) {
      if (0x7f < (int)subControl) {
        if (subControl == SC_ScrollBarGroove) {
          uVar13 = (*(int *)&option[1].super_QStyleOption.field_0x24 << 0xf) >> 0x1f & uVar23;
          goto switchD_003c18cc_caseD_2;
        }
        if ((subControl == SC_TitleBarLabel) &&
           (uVar18 = *(uint *)&option[1].super_QStyleOption.field_0x24, (uVar18 & 0x3000) != 0)) {
          uVar4 = pQVar19->x1;
          QVar30 = *pQVar19;
          _local_48 = QVar30;
          if ((uVar18 >> 0xd & 1) != 0) {
            stack0xffffffffffffffbc = QVar30._4_12_;
            local_48._0_4_ = uVar4 + uVar23;
            QVar33 = _local_48;
            uStack_40._0_4_ = QVar30.x2.m_i;
            uStack_40._4_4_ = QVar30.y2.m_i;
            local_48 = QVar33._0_8_;
            uStack_40._0_4_ = (uStack_40._0_4_ - iVar8) + 4;
          }
          if ((option[1].super_QStyleOption.field_0x25 & 0x40) != 0) {
            uStack_40._0_4_ = (uStack_40._0_4_ - iVar8) + 4;
          }
          if ((option[1].super_QStyleOption.field_0x25 & 0x80) != 0) {
            uStack_40._0_4_ = (uStack_40._0_4_ - iVar8) + 4;
          }
          if ((option[1].super_QStyleOption.field_0x26 & 2) != 0) {
            uStack_40._0_4_ = (uStack_40._0_4_ - iVar8) + 4;
          }
          if ((option[1].super_QStyleOption.field_0x26 & 1) != 0) {
            uStack_40._0_4_ = (uStack_40._0_4_ - iVar8) + 4;
          }
        }
        goto switchD_003c18cc_caseD_3;
      }
      if (subControl == SC_ScrollBarLast) goto LAB_003c1f2b;
      if (subControl != SC_ScrollBarSlider) goto switchD_003c18cc_caseD_3;
      goto LAB_003c1f42;
    }
    uVar9 = uVar13;
    switch(subControl) {
    case SC_ComboBoxFrame:
      if ((option[1].super_QStyleOption.field_0x25 & 0x20) == 0) break;
      iVar25 = (pQVar19->x1).m_i;
      local_48._4_4_ = iVar21 + 3;
      local_48._0_4_ = iVar25 + 5;
      uStack_40._0_4_ = iVar8 + iVar25 + -2;
      goto LAB_003c1f87;
    case SC_ComboBoxEditField:
switchD_003c18cc_caseD_2:
      if (((uVar18 & 1) == 0) && ((option[1].super_QStyleOption.field_0x25 & 0x40) != 0)) {
        uVar13 = uVar13 + uVar23;
      }
      else if (subControl == SC_ComboBoxEditField) break;
LAB_003c1eee:
      if ((((uVar18 & 1) == 0) || ((option[1].super_QStyleOption.field_0x25 & 0x40) == 0)) &&
         (((uVar18 & 2) == 0 || ((option[1].super_QStyleOption.field_0x25 & 0x80) == 0)))) {
        if (subControl == SC_ScrollBarFirst) break;
      }
      else {
        uVar13 = uVar13 + uVar23;
      }
    case SC_ComboBoxArrow:
      if (((uVar18 & 2) == 0) && ((option[1].super_QStyleOption.field_0x25 & 0x80) != 0)) {
        uVar9 = uVar13 + uVar23;
      }
      else {
        uVar9 = uVar13;
        if (subControl == SC_ComboBoxArrow) break;
      }
LAB_003c1f2b:
      if (((uVar18 & 1) == 0) && ((option[1].super_QStyleOption.field_0x26 & 2) != 0)) {
        uVar9 = uVar9 + uVar23;
      }
      else if (subControl == SC_ScrollBarLast) break;
LAB_003c1f42:
      if (((uVar18 & 1) == 0) || ((option[1].super_QStyleOption.field_0x26 & 2) == 0)) {
        if (subControl == SC_ScrollBarSlider) break;
      }
      else {
        uVar9 = uVar9 + uVar23;
      }
switchD_003c18cc_caseD_8:
      if ((option[1].super_QStyleOption.field_0x25 & 0x20) == 0) {
        if (subControl == SC_ComboBoxListBoxPopup) break;
      }
      else {
        uVar9 = uVar9 + uVar23;
      }
      iVar25 = (option->super_QStyleOption).rect.x2.m_i - uVar9;
      local_48._4_4_ = iVar21 + 3;
      local_48._0_4_ = iVar25 + -3;
      uStack_40._0_4_ = iVar8 + iVar25 + -10;
LAB_003c1f87:
      local_48._0_4_ = local_48._0_4_;
      local_48._4_4_ = local_48._4_4_;
      uStack_40._4_4_ = iVar21 + iVar20 + -3;
      break;
    case SC_ComboBoxEditField|SC_ComboBoxFrame:
    case SC_ComboBoxArrow|SC_ComboBoxFrame:
    case SC_ComboBoxArrow|SC_ComboBoxEditField:
    case SC_ComboBoxArrow|SC_ComboBoxEditField|SC_ComboBoxFrame:
      break;
    case SC_ComboBoxListBoxPopup:
      goto switchD_003c18cc_caseD_8;
    default:
      if (subControl == SC_ScrollBarFirst) goto LAB_003c1eee;
    }
switchD_003c18cc_caseD_3:
    LVar27 = (option->super_QStyleOption).direction;
LAB_003c1f9d:
    _local_48 = QStyle::visualRect(LVar27,pQVar19,(QRect *)local_48);
    uVar15 = local_48._8_8_;
    break;
  case CC_GroupBox:
    if (((option == (QStyleOptionComplex *)0x0) || ((option->super_QStyleOption).version < 1)) ||
       (pQVar17 = option, (option->super_QStyleOption).type != 0xf0006)) {
      pQVar17 = (QStyleOptionComplex *)0x0;
    }
    if (pQVar17 == (QStyleOptionComplex *)0x0) break;
    uVar18 = *(uint *)&pQVar17[1].super_QStyleOption.fontMetrics;
    lVar14._0_4_ = pQVar17[1].super_QStyleOption.rect.x2;
    lVar14._4_4_ = pQVar17[1].super_QStyleOption.rect.y2;
    if (lVar14 == 0) {
      iVar8 = 0;
    }
    else {
      iVar8 = QFontMetrics::height();
      uVar15 = extraout_RDX;
    }
    if (subControl == SC_ComboBoxArrow) {
      iVar21 = (option->super_QStyleOption).rect.x1.m_i;
      iVar20 = (option->super_QStyleOption).rect.y1.m_i;
      iVar25 = (option->super_QStyleOption).rect.x2.m_i;
      iVar26 = (option->super_QStyleOption).rect.y2.m_i;
      iVar10 = 0;
      if (((option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
           super_QFlagsStorage<QStyle::SubControl>.i & 1) != 0) {
        iVar10 = (**(code **)(*(long *)&(this->super_QCommonStyle).super_QStyle + 0xe0))
                           (this,0x26,option,widget);
      }
      if (iVar8 < iVar10) {
        iVar8 = iVar10;
      }
      QVar30.y1.m_i = 0;
      QVar30.x1.m_i = iVar21 + 3;
      uVar15 = (ulong)(iVar8 + iVar20 + 6);
      QVar30.y2.m_i = iVar26 + -3;
      QVar30.x2.m_i = iVar25 + -3;
      goto LAB_003c1fbd;
    }
    if (subControl == SC_ComboBoxListBoxPopup) break;
    auVar31 = QFontMetrics::boundingRect((QString *)&(option->super_QStyleOption).fontMetrics);
    iVar25 = auVar31._8_4_ - auVar31._0_4_;
    pQVar11 = QStyle::proxy((QStyle *)(auVar31._0_8_ >> 0x20));
    pQVar11 = (QStyle *)(**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x25,option,widget);
    pQVar12 = QStyle::proxy(pQVar11);
    iVar8 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x26,option,widget);
    iVar20 = (int)pQVar11;
    uVar23 = iVar20 + 5;
    _local_48 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    iVar21 = iVar25 + (-((option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                         super_QFlagsStorage<QStyle::SubControl>.i & 1) & uVar23) + 3;
    iVar26 = ((option->super_QStyleOption).rect.x2.m_i - (option->super_QStyleOption).rect.x1.m_i) +
             1;
    uVar9 = iVar26 - iVar21;
    if (uVar9 != 0 && iVar21 <= iVar26) {
      uVar13 = uVar18 & 0x1e0;
      uVar18 = uVar18 & 0x1f;
      if (uVar18 == 1) {
        if (uVar13 == 0x80) {
          pQVar11 = QStyle::proxy((QStyle *)(ulong)uVar9);
          RVar22.m_i = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x4b,option,widget);
          iVar21 = RVar22.m_i - local_48._0_4_;
          uStack_40._0_4_ = uStack_40._0_4_ + iVar21;
          local_48._0_4_ = RVar22.m_i;
        }
      }
      else if (uVar18 == 2) {
        iVar10 = 0;
        if (uVar13 == 0x80) {
          pQVar11 = QStyle::proxy((QStyle *)0x0);
          iVar10 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x4d,pQVar17,widget);
        }
        RVar22.m_i = iVar26 - (iVar21 + iVar10);
        iVar21 = RVar22.m_i - local_48._0_4_;
        uStack_40._0_4_ = uStack_40._0_4_ + iVar21;
        local_48._0_4_ = RVar22.m_i;
      }
      else if (uVar18 == 4) {
        auVar5._4_8_ = 0;
        auVar5._0_4_ = (int)uVar9 / 2 - 1;
        _local_48 = auVar5 << 0x40;
        uStack_40._4_4_ = -1;
        local_48._0_4_ = (int)uVar9 / 2;
      }
    }
    RVar22.m_i = (auVar31._12_4_ - auVar31._4_4_) + 3;
    uVar6 = local_48._0_4_;
    if (subControl == SC_ComboBoxEditField) {
      iVar8 = iVar25 + uVar6 + 2;
      uStack_40._0_4_ = iVar8;
      uStack_40._4_4_ = RVar22.m_i;
      local_48._4_4_ = 1;
      local_48 = (undefined1  [8])CONCAT44(local_48._4_4_,uVar6);
      if (((option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
           super_QFlagsStorage<QStyle::SubControl>.i & 1) != 0) {
        local_48._4_4_ = 1;
        local_48._0_4_ = uVar6 + uVar23;
        uStack_40._0_4_ = iVar8 + uVar23;
        goto LAB_003c2136;
      }
    }
    else if (subControl == SC_ComboBoxFrame) {
      uStack_40._0_4_ = iVar20 + uVar6 + -1;
      iVar21 = 0;
      if (RVar22.m_i - iVar8 != 0 && iVar8 <= RVar22.m_i) {
        iVar21 = (RVar22.m_i - iVar8) / 2;
      }
      RVar22.m_i = iVar8 + -1 + iVar21;
      uStack_40._4_4_ = RVar22.m_i;
      local_48._4_4_ = iVar21;
      local_48._0_4_ = uVar6 + 1;
      uStack_40._0_4_ = iVar20 + uVar6;
LAB_003c2136:
      uStack_40._4_4_ = RVar22.m_i;
    }
    QVar33 = QStyle::visualRect((option->super_QStyleOption).direction,
                                &(option->super_QStyleOption).rect,(QRect *)local_48);
    QVar30 = QVar33;
    goto LAB_003c1fb9;
  }
switchD_003c15b4_caseD_2:
  QVar30 = _local_48;
  QVar33.x2.m_i = (int)uVar15;
  QVar33.y2.m_i = (int)(uVar15 >> 0x20);
  QVar33.x1.m_i = local_48._0_4_;
  QVar33.y1.m_i = local_48._4_4_;
  _local_48 = QVar30;
LAB_003c1fb9:
  uVar15 = QVar33._0_8_ >> 0x20;
LAB_003c1fbd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  QVar32._0_8_ = QVar30._0_8_ & 0xffffffff | uVar15 << 0x20;
  QVar32.x2.m_i = (int)QVar30._8_8_;
  QVar32.y2.m_i = (int)((ulong)QVar30._8_8_ >> 0x20);
  return QVar32;
}

Assistant:

QRect QFusionStyle::subControlRect(ComplexControl control, const QStyleOptionComplex *option,
                                   SubControl subControl, const QWidget *widget) const
{
    QRect rect = QCommonStyle::subControlRect(control, option, subControl, widget);

    switch (control) {
#if QT_CONFIG(slider)
    case CC_Slider:
        if (const QStyleOptionSlider *slider = qstyleoption_cast<const QStyleOptionSlider *>(option)) {
            int tickSize = proxy()->pixelMetric(PM_SliderTickmarkOffset, option, widget);
            switch (subControl) {
            case SC_SliderHandle: {
                const bool bothTicks = (slider->tickPosition & QSlider::TicksBothSides) == QSlider::TicksBothSides;
                if (slider->orientation == Qt::Horizontal) {
                    rect.setHeight(proxy()->pixelMetric(PM_SliderThickness, option, widget));
                    rect.setWidth(proxy()->pixelMetric(PM_SliderLength, option, widget));
                    int centerY = slider->rect.center().y() - rect.height() / 2;
                    if (!bothTicks) {
                        if (slider->tickPosition & QSlider::TicksAbove)
                            centerY += tickSize;
                        if (slider->tickPosition & QSlider::TicksBelow)
                            centerY -= tickSize - 1;
                    }
                    rect.moveTop(centerY);
                } else {
                    rect.setWidth(proxy()->pixelMetric(PM_SliderThickness, option, widget));
                    rect.setHeight(proxy()->pixelMetric(PM_SliderLength, option, widget));
                    int centerX = slider->rect.center().x() - rect.width() / 2;
                    if (!bothTicks) {
                        if (slider->tickPosition & QSlider::TicksAbove)
                            centerX += tickSize;
                        if (slider->tickPosition & QSlider::TicksBelow)
                            centerX -= tickSize - 1;
                    }
                    rect.moveLeft(centerX);
                }
            }
                break;
            case SC_SliderGroove: {
                QPoint grooveCenter = slider->rect.center();
                const int grooveThickness = QStyleHelper::dpiScaled(7, option);
                const bool bothTicks = (slider->tickPosition & QSlider::TicksBothSides) == QSlider::TicksBothSides;
                if (slider->orientation == Qt::Horizontal) {
                    rect.setHeight(grooveThickness);
                    if (!bothTicks) {
                        if (slider->tickPosition & QSlider::TicksAbove)
                            grooveCenter.ry() += tickSize;
                        if (slider->tickPosition & QSlider::TicksBelow)
                            grooveCenter.ry() -= tickSize - 1;
                    }
                } else {
                    rect.setWidth(grooveThickness);
                    if (!bothTicks) {
                        if (slider->tickPosition & QSlider::TicksAbove)
                            grooveCenter.rx() += tickSize;
                        if (slider->tickPosition & QSlider::TicksBelow)
                            grooveCenter.rx() -= tickSize - 1;
                    }
                }
                rect.moveCenter(grooveCenter);
                break;
            }
            default:
                break;
            }
        }
        break;
#endif // QT_CONFIG(slider)
#if QT_CONFIG(spinbox)
    case CC_SpinBox:
        if (const QStyleOptionSpinBox *spinbox = qstyleoption_cast<const QStyleOptionSpinBox *>(option)) {
            int center = spinbox->rect.height() / 2;
            int fw = spinbox->frame ? 3 : 0; // Is drawn with 3 pixels width in drawComplexControl, independently from PM_SpinBoxFrameWidth
            int y = fw;
            const int buttonWidth = QStyleHelper::dpiScaled(14, option);
            int x, lx, rx;
            x = spinbox->rect.width() - y - buttonWidth + 2;
            lx = fw;
            rx = x - fw;
            switch (subControl) {
            case SC_SpinBoxUp:
                if (spinbox->buttonSymbols == QAbstractSpinBox::NoButtons)
                    return QRect();
                rect = QRect(x, fw, buttonWidth, center - fw);
                break;
            case SC_SpinBoxDown:
                if (spinbox->buttonSymbols == QAbstractSpinBox::NoButtons)
                    return QRect();

                rect = QRect(x, center, buttonWidth, spinbox->rect.bottom() - center - fw + 1);
                break;
            case SC_SpinBoxEditField:
                if (spinbox->buttonSymbols == QAbstractSpinBox::NoButtons) {
                    rect = QRect(lx, fw, spinbox->rect.width() - 2*fw, spinbox->rect.height() - 2*fw);
                } else {
                    rect = QRect(lx, fw, rx - qMax(fw - 1, 0), spinbox->rect.height() - 2*fw);
                }
                break;
            case SC_SpinBoxFrame:
                rect = spinbox->rect;
                break;
            default:
                break;
            }
            rect = visualRect(spinbox->direction, spinbox->rect, rect);
        }
        break;
#endif // QT_CONFIG(spinbox)
    case CC_GroupBox:
        if (const QStyleOptionGroupBox *groupBox = qstyleoption_cast<const QStyleOptionGroupBox *>(option)) {
            const int groupBoxTextAlignment = groupBox->textAlignment;
            const bool hasVerticalAlignment = (groupBoxTextAlignment & Qt::AlignVertical_Mask) == Qt::AlignVCenter;
            const int fontMetricsHeight = groupBox->text.isEmpty() ? 0 : groupBox->fontMetrics.height();

            if (subControl == SC_GroupBoxFrame)
                return rect;
            else if (subControl == SC_GroupBoxContents) {
                QRect frameRect = option->rect.adjusted(0, 0, 0, -groupBoxBottomMargin);
                int margin = 3;
                int leftMarginExtension = 0;
                const int indicatorHeight = option->subControls.testFlag(SC_GroupBoxCheckBox) ?
                                                        pixelMetric(PM_IndicatorHeight, option, widget) : 0;
                const int topMargin = qMax(indicatorHeight, fontMetricsHeight) +
                                        groupBoxTopMargin;
                return frameRect.adjusted(leftMarginExtension + margin, margin + topMargin, -margin, -margin - groupBoxBottomMargin);
            }

            QSize textSize = option->fontMetrics.boundingRect(groupBox->text).size() + QSize(2, 2);
            int indicatorWidth = proxy()->pixelMetric(PM_IndicatorWidth, option, widget);
            int indicatorHeight = proxy()->pixelMetric(PM_IndicatorHeight, option, widget);

            const int width = textSize.width()
                + (option->subControls & QStyle::SC_GroupBoxCheckBox ? indicatorWidth + 5 : 0);

            rect = QRect();

            if (option->rect.width() > width) {
                switch (groupBoxTextAlignment & Qt::AlignHorizontal_Mask) {
                case Qt::AlignHCenter:
                    rect.moveLeft((option->rect.width() - width) / 2);
                    break;
                case Qt::AlignRight:
                    rect.moveLeft(option->rect.width() - width
                                  - (hasVerticalAlignment ? proxy()->pixelMetric(PM_LayoutRightMargin, groupBox, widget) : 0));
                    break;
                case Qt::AlignLeft:
                    if (hasVerticalAlignment)
                        rect.moveLeft(proxy()->pixelMetric(PM_LayoutLeftMargin, option, widget));
                    break;
                }
            }

            if (subControl == SC_GroupBoxCheckBox) {
                rect.setWidth(indicatorWidth);
                rect.setHeight(indicatorHeight);
                rect.moveTop(textSize.height() > indicatorHeight ? (textSize.height() - indicatorHeight) / 2 : 0);
                rect.translate(1, 0);
            } else if (subControl == SC_GroupBoxLabel) {
                rect.setSize(textSize);
                rect.moveTop(1);
                if (option->subControls & QStyle::SC_GroupBoxCheckBox)
                    rect.translate(indicatorWidth + 5, 0);
            }
            return visualRect(option->direction, option->rect, rect);
        }

        return rect;

    case CC_ComboBox:
        switch (subControl) {
        case SC_ComboBoxArrow: {
            const qreal dpi = QStyleHelper::dpi(option);
            rect = visualRect(option->direction, option->rect, rect);
            rect.setRect(rect.right() - int(QStyleHelper::dpiScaled(18, dpi)), rect.top() - 2,
                         int(QStyleHelper::dpiScaled(19, dpi)), rect.height() + 4);
            rect = visualRect(option->direction, option->rect, rect);
        }
            break;
        case SC_ComboBoxEditField: {
            int frameWidth = 2;
            rect = visualRect(option->direction, option->rect, rect);
            rect.setRect(option->rect.left() + frameWidth, option->rect.top() + frameWidth,
                         option->rect.width() - int(QStyleHelper::dpiScaled(19, option)) - 2 * frameWidth,
                         option->rect.height() - 2 * frameWidth);
            if (const QStyleOptionComboBox *box = qstyleoption_cast<const QStyleOptionComboBox *>(option)) {
                if (!box->editable) {
                    rect.adjust(2, 0, 0, 0);
                    if (box->state & (State_Sunken | State_On))
                        rect.translate(1, 1);
                }
            }
            rect = visualRect(option->direction, option->rect, rect);
            break;
        }
        default:
            break;
        }
        break;
    case CC_TitleBar:
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(option)) {
            SubControl sc = subControl;
            QRect &ret = rect;
            const int indent = 3;
            const int controlTopMargin = 3;
            const int controlBottomMargin = 3;
            const int controlWidthMargin = 2;
            const int controlHeight = tb->rect.height() - controlTopMargin - controlBottomMargin ;
            const int delta = controlHeight + controlWidthMargin;
            int offset = 0;

            bool isMinimized = tb->titleBarState & Qt::WindowMinimized;
            bool isMaximized = tb->titleBarState & Qt::WindowMaximized;

            switch (sc) {
            case SC_TitleBarLabel:
                if (tb->titleBarFlags & (Qt::WindowTitleHint | Qt::WindowSystemMenuHint)) {
                    ret = tb->rect;
                    if (tb->titleBarFlags & Qt::WindowSystemMenuHint)
                        ret.adjust(delta, 0, -delta, 0);
                    if (tb->titleBarFlags & Qt::WindowMinimizeButtonHint)
                        ret.adjust(0, 0, -delta, 0);
                    if (tb->titleBarFlags & Qt::WindowMaximizeButtonHint)
                        ret.adjust(0, 0, -delta, 0);
                    if (tb->titleBarFlags & Qt::WindowShadeButtonHint)
                        ret.adjust(0, 0, -delta, 0);
                    if (tb->titleBarFlags & Qt::WindowContextHelpButtonHint)
                        ret.adjust(0, 0, -delta, 0);
                }
                break;
            case SC_TitleBarContextHelpButton:
                if (tb->titleBarFlags & Qt::WindowContextHelpButtonHint)
                    offset += delta;
                Q_FALLTHROUGH();
            case SC_TitleBarMinButton:
                if (!isMinimized && (tb->titleBarFlags & Qt::WindowMinimizeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarMinButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarNormalButton:
                if (isMinimized && (tb->titleBarFlags & Qt::WindowMinimizeButtonHint))
                    offset += delta;
                else if (isMaximized && (tb->titleBarFlags & Qt::WindowMaximizeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarNormalButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarMaxButton:
                if (!isMaximized && (tb->titleBarFlags & Qt::WindowMaximizeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarMaxButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarShadeButton:
                if (!isMinimized && (tb->titleBarFlags & Qt::WindowShadeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarShadeButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarUnshadeButton:
                if (isMinimized && (tb->titleBarFlags & Qt::WindowShadeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarUnshadeButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarCloseButton:
                if (tb->titleBarFlags & Qt::WindowSystemMenuHint)
                    offset += delta;
                else if (sc == SC_TitleBarCloseButton)
                    break;
                ret.setRect(tb->rect.right() - indent - offset, tb->rect.top() + controlTopMargin,
                            controlHeight, controlHeight);
                break;
            case SC_TitleBarSysMenu:
                if (tb->titleBarFlags & Qt::WindowSystemMenuHint) {
                    ret.setRect(tb->rect.left() + controlWidthMargin + indent, tb->rect.top() + controlTopMargin,
                                controlHeight, controlHeight);
                }
                break;
            default:
                break;
            }
            ret = visualRect(tb->direction, tb->rect, ret);
        }
        break;
    default:
        break;
    }

    return rect;
}